

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  ImDrawList *draw_list;
  ImVec2 IVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  ImGuiContext *pIVar6;
  ImGuiWindow *pIVar7;
  char *text;
  bool *pbVar8;
  bool bVar9;
  bool bVar10;
  ImS8 IVar11;
  short sVar12;
  ImU32 IVar13;
  uint uVar14;
  int iVar15;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar16;
  size_t sVar17;
  undefined8 extraout_RAX;
  char *pcVar18;
  byte bVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ImGuiCol idx;
  long lVar23;
  ImGuiTabItem *pIVar24;
  uint uVar25;
  undefined1 uVar26;
  undefined7 uVar28;
  undefined8 uVar27;
  undefined1 auVar29 [4];
  float fVar30;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 IVar31;
  bool text_clipped;
  bool just_closed;
  uint local_b4;
  ImGuiContext *local_b0;
  uint local_a4;
  ImGuiWindow *local_a0;
  uint local_98;
  ImU32 local_94;
  ImGuiTextBuffer *local_90;
  ImRect bb;
  bool held;
  float local_64;
  bool hovered;
  undefined7 uStack_5f;
  float fStack_5c;
  undefined1 local_58 [4];
  undefined1 auStack_54 [12];
  int local_44;
  char *local_40;
  bool *local_38;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar6 = GImGui;
  local_a0 = GImGui->CurrentWindow;
  if (local_a0->SkipItems != false) {
    return false;
  }
  IVar13 = TabBarCalcTabID((ImGuiTabBar *)(ulong)(uint)tab_bar->Flags,label);
  if (p_open != (bool *)0x0) {
    if (*p_open == false) {
      PushItemFlag(0x18,true);
      bb.Min.x = 0.0;
      bb.Min.y = 0.0;
      bb.Max.x = 0.0;
      bb.Max.y = 0.0;
      ItemAdd(&bb,IVar13,(ImRect *)0x0);
      PopItemFlag();
      return false;
    }
    if (((uint)flags >> 0x15 & 1) != 0) {
      __assert_fail("!p_open || !(flags & ImGuiTabItemFlags_Button)",
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_widgets.cpp"
                    ,0x1d80,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)")
      ;
    }
  }
  local_b0 = pIVar6;
  if ((~flags & 0xc0U) == 0) {
    __assert_fail("(flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_widgets.cpp"
                  ,0x1d81,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  local_38 = (bool *)0x0;
  uVar25 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_38 = p_open;
    uVar25 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    uVar25 = flags;
  }
  IVar3 = TabItemCalcSize(label,local_38 != (bool *)0x0);
  auVar29 = (undefined1  [4])IVar3.x;
  uVar14 = (tab_bar->Tabs).Size;
  unique0x10000198 = extraout_XMM0_Dc;
  local_58 = (undefined1  [4])IVar3.x;
  auStack_54._0_4_ = IVar3.y;
  unique0x1000019c = extraout_XMM0_Dd;
  if (0 < (int)uVar14 && IVar13 != 0) {
    pIVar16 = (tab_bar->Tabs).Data;
    lVar23 = 0;
    do {
      if (*(ImU32 *)((long)&pIVar16->ID + lVar23) == IVar13) {
        pIVar24 = (ImGuiTabItem *)((long)&pIVar16->ID + lVar23);
        bVar5 = 0;
        goto LAB_001c9aac;
      }
      lVar23 = lVar23 + 0x24;
    } while ((ulong)uVar14 * 0x24 != lVar23);
  }
  if (uVar14 == (tab_bar->Tabs).Capacity) {
    if (uVar14 == 0) {
      iVar20 = 8;
    }
    else {
      iVar20 = (int)uVar14 / 2 + uVar14;
    }
    iVar22 = uVar14 + 1;
    if ((int)(uVar14 + 1) < iVar20) {
      iVar22 = iVar20;
    }
    pIVar16 = (ImGuiTabItem *)MemAlloc((long)iVar22 * 0x24);
    pIVar24 = (tab_bar->Tabs).Data;
    if (pIVar24 != (ImGuiTabItem *)0x0) {
      memcpy(pIVar16,pIVar24,(long)(tab_bar->Tabs).Size * 0x24);
      MemFree((tab_bar->Tabs).Data);
    }
    (tab_bar->Tabs).Data = pIVar16;
    (tab_bar->Tabs).Capacity = iVar22;
    uVar14 = (tab_bar->Tabs).Size;
    auVar29 = local_58;
  }
  else {
    pIVar16 = (tab_bar->Tabs).Data;
  }
  pIVar16[(int)uVar14].ID = 0;
  pIVar16[(int)uVar14].Flags = 0;
  pIVar16[(int)uVar14].LastFrameVisible = -1;
  pIVar16[(int)uVar14].LastFrameSelected = -1;
  pIVar16[(int)uVar14].Offset = 0.0;
  pIVar16[(int)uVar14].Width = 0.0;
  pIVar16[(int)uVar14].ContentWidth = 0.0;
  pIVar16 = pIVar16 + (int)uVar14;
  pIVar16->NameOffset = -1;
  pIVar16->BeginOrder = -1;
  pIVar16->IndexDuringLayout = -1;
  pIVar16->WantClose = false;
  pIVar16->field_0x23 = 0;
  iVar20 = (tab_bar->Tabs).Size;
  uVar14 = iVar20 + 1;
  (tab_bar->Tabs).Size = uVar14;
  if (iVar20 < 0) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui.h"
                  ,0x64e,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
  }
  pIVar16 = (tab_bar->Tabs).Data;
  pIVar24 = pIVar16 + ((ulong)uVar14 - 1);
  pIVar24->ID = IVar13;
  pIVar16[(ulong)uVar14 - 1].Width = (float)auVar29;
  tab_bar->TabsAddedNew = true;
  bVar5 = 1;
LAB_001c9aac:
  local_94 = IVar13;
  local_40 = label;
  if ((pIVar24 < pIVar16) || (pIVar16 + (int)uVar14 <= pIVar24)) {
    __assert_fail("it >= Data && it < Data + Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui.h"
                  ,0x665,
                  "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]");
  }
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar24 - (int)pIVar16) >> 2) * -0x71c7;
  pIVar24->ContentWidth = (float)auVar29;
  sVar12 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar12 + 1;
  pIVar24->BeginOrder = sVar12;
  local_a4 = tab_bar->Flags;
  iVar15 = tab_bar->PrevFrameVisible + 1;
  iVar20 = local_b0->FrameCount;
  iVar21 = pIVar24->LastFrameVisible + 1;
  pIVar24->LastFrameVisible = iVar20;
  pIVar24->Flags = uVar25;
  local_90 = &tab_bar->TabsNames;
  iVar22 = (tab_bar->TabsNames).Buf.Size;
  sVar12 = (short)iVar22 + -1;
  if (iVar22 == 0) {
    sVar12 = 0;
  }
  pIVar24->NameOffset = sVar12;
  sVar17 = strlen(label);
  ImGuiTextBuffer::append(local_90,label,label + sVar17 + 1);
  IVar13 = local_94;
  bVar19 = iVar21 < iVar20;
  if (((iVar21 < iVar20) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if (iVar15 < iVar20) {
      if ((uVar25 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) goto LAB_001c9bab;
    }
    else if ((uVar25 >> 0x15 & 1) == 0) {
LAB_001c9bab:
      tab_bar->NextSelectedTabId = local_94;
    }
  }
  if ((((uVar25 & 2) != 0) && (tab_bar->SelectedTabId != local_94)) && ((uVar25 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = local_94;
  }
  uVar28 = (undefined7)((ulong)label >> 8);
  if (tab_bar->VisibleTabId == local_94) {
    tab_bar->VisibleTabWasSubmitted = true;
    uVar27 = CONCAT71(uVar28,1);
  }
  else if ((tab_bar->SelectedTabId == 0 && iVar15 < iVar20) && ((tab_bar->Tabs).Size == 1)) {
    uVar27 = CONCAT71(uVar28,(tab_bar->Flags & 2) == 0);
  }
  else {
    uVar27 = 0;
  }
  if ((bool)((bVar5 | iVar20 <= iVar15) & iVar21 < iVar20)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,IVar13,(ImRect *)0x0);
    PopItemFlag();
    return (bool)((uVar25 >> 0x15 & 1) == 0 & (byte)uVar27);
  }
  if (tab_bar->SelectedTabId == local_94) {
    pIVar24->LastFrameSelected = local_b0->FrameCount;
  }
  uVar14 = pIVar24->Flags;
  fVar2 = pIVar24->Width;
  fVar30 = pIVar24->Offset;
  if ((uVar14 & 0xc0) == 0) {
    fVar30 = (float)(int)(fVar30 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar30 + (tab_bar->BarRect).Min.x;
  IVar3 = (local_a0->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar31.y = bb.Min.y;
  IVar31.x = bb.Min.x;
  (local_a0->DC).CursorPos = IVar31;
  bb.Max.x = fVar2 + bb.Min.x;
  bb.Max.y = (float)auStack_54._0_4_ + bb.Min.y;
  local_b4 = uVar25;
  local_98 = iVar20;
  local_90 = (ImGuiTextBuffer *)uVar27;
  local_44 = iVar21;
  if ((uVar14 & 0xc0) == 0) {
    fVar2 = tab_bar->ScrollingRectMinX;
    if ((fVar2 <= bb.Min.x) && (bb.Max.x <= tab_bar->ScrollingRectMaxX)) goto LAB_001c9d0f;
    fStack_5c = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar2 <= bb.Min.x) & (uint)fVar2 |
                      (uint)bb.Min.x & -(uint)(fVar2 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_64 = bb.Max.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    local_58 = (undefined1  [4])(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
LAB_001c9d0f:
    auVar4._12_4_ = 0;
    auVar4._0_12_ = auStack_54;
    _local_58 = auVar4 << 0x20;
  }
  pIVar7 = local_a0;
  pIVar6 = local_b0;
  _hovered = bb.Max.x - bb.Min.x;
  fStack_5c = bb.Max.y - bb.Min.y;
  IVar31 = (local_a0->DC).CursorMaxPos;
  ItemSize((ImVec2 *)&hovered,(local_b0->Style).FramePadding.y);
  IVar13 = local_94;
  (pIVar7->DC).CursorMaxPos = IVar31;
  bVar9 = ItemAdd(&bb,local_94,(ImRect *)0x0);
  if (!bVar9) {
    uVar26 = SUB81(local_90,0);
    if (local_58[0] != '\0') {
      PopClipRect();
    }
    (local_a0->DC).CursorPos = IVar3;
    return (bool)uVar26;
  }
  uVar25 = local_b4 & 0x200000;
  bVar9 = ButtonBehavior(&bb,IVar13,&hovered,&held,
                         (uVar25 >> 0x11) + (uint)pIVar6->DragDropActive * 0x200 + 0x1010);
  pbVar8 = local_38;
  if ((bVar9) && (uVar25 == 0)) {
    tab_bar->NextSelectedTabId = IVar13;
  }
  hovered = (bool)(hovered | local_b0->HoveredId == IVar13);
  if (held == false) {
    bVar10 = local_44 < (int)local_98;
    SetItemAllowOverlap();
    bVar19 = held ^ 1U | bVar10;
    IVar13 = local_94;
  }
  if (((((bVar19 & 1) == 0) && (bVar10 = IsMouseDragging(0,-1.0), bVar10)) &&
      (local_b0->DragDropActive == false)) && ((tab_bar->Flags & 1) != 0)) {
    fVar2 = (local_b0->IO).MouseDelta.x;
    if ((0.0 <= fVar2) ||
       (pIVar1 = &(local_b0->IO).MousePos, bb.Min.x < pIVar1->x || bb.Min.x == pIVar1->x)) {
      if ((fVar2 <= 0.0) || ((local_b0->IO).MousePos.x <= bb.Max.x)) goto LAB_001c9f29;
      IVar11 = '\x01';
    }
    else {
      IVar11 = -1;
    }
    if (tab_bar->ReorderRequestTabId != 0) {
      __assert_fail("tab_bar->ReorderRequestTabId == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_widgets.cpp"
                    ,0x1c9c,
                    "void ImGui::TabBarQueueReorder(ImGuiTabBar *, const ImGuiTabItem *, int)");
    }
    tab_bar->ReorderRequestTabId = pIVar24->ID;
    tab_bar->ReorderRequestDir = IVar11;
  }
LAB_001c9f29:
  draw_list = local_a0->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if ((char)local_90 == '\0') {
      idx = (uint)((local_a4 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_a4 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  local_a4 = CONCAT31(local_a4._1_3_,bVar9);
  local_98 = uVar25;
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,local_b4,col);
  RenderNavHighlight(&bb,IVar13,1);
  bVar9 = IsItemHovered(8);
  if (bVar9) {
    bVar9 = IsMouseClicked(1,false);
    if (bVar9) {
      uVar25 = local_b4 >> 0x15 & 1;
    }
    else {
      bVar9 = IsMouseReleased(1);
      uVar25 = local_98;
      if (!bVar9) goto LAB_001c9ff9;
    }
    if (uVar25 == 0) {
      tab_bar->NextSelectedTabId = IVar13;
    }
  }
LAB_001c9ff9:
  uVar25 = (uint)tab_bar->Flags >> 1 & 4 | local_b4;
  if (pbVar8 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,IVar13);
  }
  text = local_40;
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar25,tab_bar->FramePadding,local_40,IVar13,close_button_id,
             SUB81(local_90,0),&just_closed,&text_clipped);
  if ((pbVar8 != (bool *)0x0) && (just_closed != false)) {
    *pbVar8 = false;
    TabBarCloseTab(tab_bar,pIVar24);
  }
  if (local_58[0] != '\0') {
    PopClipRect();
  }
  (local_a0->DC).CursorPos = IVar3;
  uVar26 = SUB81(local_90,0);
  if ((((text_clipped == true) && (local_b0->HoveredId == IVar13)) && (held == false)) &&
     (((local_b0->TooltipSlowDelay <= local_b0->HoveredIdNotActiveTimer &&
        local_b0->HoveredIdNotActiveTimer != local_b0->TooltipSlowDelay &&
       (bVar9 = IsItemHovered(0), bVar9)) &&
      (((tab_bar->Flags & 0x20) == 0 && ((pIVar24->Flags & 0x10) == 0)))))) {
    pcVar18 = FindRenderedTextEnd(text,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar18 - (int)text),text);
  }
  if (((local_b4 >> 0x15 & 1) != 0) &&
     (uVar26 = (undefined1)local_a4, tab_bar->SelectedTabId == pIVar24->ID)) {
    __assert_fail("!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)",
                  "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_widgets.cpp"
                  ,0x1e38,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  return (bool)uVar26;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS16)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}